

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O2

IntSet * __thiscall
OSTEI_VRR_Algorithm_Base::GetAllInt_2p
          (IntSet *__return_storage_ptr__,OSTEI_VRR_Algorithm_Base *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var2 = (this->qamint_2p_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->qamint_2p_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_range_unique<std::_Rb_tree_const_iterator<int>>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               __return_storage_ptr__,p_Var2[3]._M_parent,
               (_Rb_tree_const_iterator<int>)&p_Var2[2]._M_right);
  }
  return __return_storage_ptr__;
}

Assistant:

IntSet OSTEI_VRR_Algorithm_Base::GetAllInt_2p(void) const
{
    IntSet iset;
    for(const auto & it : qamint_2p_)
        iset.insert(it.second.begin(), it.second.end());
    return iset;
}